

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int GetLatestDataFromThreadMTx(MT *pMT,MTDATA *pMTData)

{
  int iVar1;
  CRITICAL_SECTION *__mutex;
  long lVar2;
  MTDATA *__src;
  
  __mutex = MTCS;
  __src = mtdataMT;
  lVar2 = 0;
  do {
    if ((MT *)addrsMT[lVar2] == pMT) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      memcpy(pMTData,__src,0x130);
      iVar1 = resMT[lVar2];
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return iVar1;
    }
    lVar2 = lVar2 + 1;
    __mutex = __mutex + 1;
    __src = __src + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int GetLatestDataFromThreadMTx(MT* pMT, MTDATA* pMTData)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsMT[id] != pMT)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&MTCS[id]);
	*pMTData = mtdataMT[id];
	res = resMT[id];
	LeaveCriticalSection(&MTCS[id]);

	return res;
}